

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var __thiscall
Js::JavascriptNativeIntArray::DirectGetItem(JavascriptNativeIntArray *this,uint32 index)

{
  Type TVar1;
  bool bVar2;
  DynamicObjectFlags DVar3;
  int iVar4;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  Type *pTVar5;
  Type *pTVar6;
  Type local_28;
  Var element;
  
  bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if ((bVar2) &&
     (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this),
     this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  DVar3 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  pTVar5 = (Type *)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion +
                   0x20);
  if ((DVar3 & HasSegmentMap) == None) {
    pTVar5 = &(this->super_JavascriptNativeArray).super_JavascriptArray.segmentUnion;
  }
  TVar1 = *pTVar5;
  if (((*(uint *)TVar1 <= index) && (index - *(uint *)TVar1 < *(uint *)((long)TVar1 + 4))) &&
     ((ulong)((uint *)((long)TVar1 + 0x18))[index - *(uint *)TVar1] != 0xfff80002)) {
    return (Var)((ulong)((uint *)((long)TVar1 + 0x18))[index - *(uint *)TVar1] | 0x1000000000000);
  }
  pTVar6 = &local_28;
  local_28.ptr = (RecyclableObject *)0x0;
  iVar4 = (**(code **)((long)(this->super_JavascriptNativeArray).super_JavascriptArray.
                             super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))
                    (this,index,pTVar6);
  if (iVar4 == 0) {
    pTVar6 = &(((((this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                  super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).undefinedValue;
  }
  return pTVar6->ptr;
}

Assistant:

Var JavascriptNativeIntArray::DirectGetItem(uint32 index)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        SparseArraySegment<int32> *seg = (SparseArraySegment<int32>*)this->GetLastUsedSegment();
        uint32 offset = index - seg->left;
        if (index >= seg->left && offset < seg->length)
        {
            if (!SparseArraySegment<int32>::IsMissingItem(&seg->elements[offset]))
            {
                return JavascriptNumber::ToVar(seg->elements[offset], GetScriptContext());
            }
        }
        Var element = nullptr;
        if (DirectGetItemAtFull(index, &element))
        {
            return element;
        }
        return GetType()->GetLibrary()->GetUndefined();
    }